

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<unsigned_long> *
wasm::WATParser::results<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<unsigned_long> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this;
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  string_view expected;
  string_view expected_00;
  undefined1 local_a8 [8];
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  char local_31;
  
  expected._M_str = "result";
  expected._M_len = 6;
  local_31 = Lexer::takeSExprStart(&ctx->in,expected);
  lVar3 = 0;
  if ((bool)local_31) {
    this = (_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
           ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    do {
      while (bVar2 = Lexer::takeRParen(&ctx->in), !bVar2) {
        valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_a8,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)this,
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                     type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                     type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x10
                   );
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> = puVar1;
          if ((undefined1 *)
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_48) {
            *puVar1 = CONCAT71(uStack_47,local_48);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_40;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> =
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> +
                      0x10) = CONCAT71(uStack_47,local_48);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 8) =
               local_50;
          local_48 = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20) =
               '\x02';
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_48;
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
          return __return_storage_ptr__;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  (this);
        lVar3 = lVar3 + 1;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
      }
      expected_00._M_str = "result";
      expected_00._M_len = 6;
      bVar2 = Lexer::takeSExprStart(&ctx->in,expected_00);
    } while (bVar2);
  }
  if (local_31 == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  else {
    *(long *)&(__return_storage_ptr__->val).
              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> = lVar3;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
             .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}